

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O0

void isaac_init(isaacctx *ctx,int flag)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int in_ESI;
  isaacctx *in_RDI;
  uint32_t *r;
  uint32_t *m;
  uint32_t h;
  uint32_t g;
  uint32_t f;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  int i;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint32_t local_18;
  uint local_14;
  int local_10;
  
  in_RDI->c = 0;
  in_RDI->b = 0;
  in_RDI->a = 0;
  local_30 = 0x9e3779b9;
  local_2c = 0x9e3779b9;
  local_28 = 0x9e3779b9;
  local_24 = 0x9e3779b9;
  local_20 = 0x9e3779b9;
  local_1c = 0x9e3779b9;
  local_18 = 0x9e3779b9;
  local_14 = 0x9e3779b9;
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    uVar1 = local_18 << 0xb ^ local_14;
    iVar2 = uVar1 + local_20;
    uVar3 = local_1c >> 2 ^ local_1c + local_18;
    local_24 = uVar3 + local_24;
    uVar4 = iVar2 * 0x100 ^ iVar2 + local_1c;
    iVar5 = uVar4 + local_28;
    local_20 = local_24 >> 0x10 ^ local_24 + iVar2;
    local_2c = local_20 + local_2c;
    local_24 = iVar5 * 0x400 ^ iVar5 + local_24;
    iVar2 = local_24 + local_30;
    local_28 = local_2c >> 4 ^ local_2c + iVar5;
    uVar1 = local_28 + uVar1;
    local_2c = iVar2 * 0x100 ^ iVar2 + local_2c;
    local_18 = local_2c + uVar3;
    local_30 = uVar1 >> 9 ^ uVar1 + iVar2;
    local_1c = local_30 + uVar4;
    local_14 = local_18 + uVar1;
  }
  if (in_ESI == 0) {
    for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 8) {
      uVar1 = local_18 << 0xb ^ local_14;
      iVar2 = uVar1 + local_20;
      uVar3 = local_1c >> 2 ^ local_1c + local_18;
      local_24 = uVar3 + local_24;
      uVar4 = iVar2 * 0x100 ^ iVar2 + local_1c;
      iVar5 = uVar4 + local_28;
      local_20 = local_24 >> 0x10 ^ local_24 + iVar2;
      local_2c = local_20 + local_2c;
      local_24 = iVar5 * 0x400 ^ iVar5 + local_24;
      iVar2 = local_24 + local_30;
      local_28 = local_2c >> 4 ^ local_2c + iVar5;
      uVar1 = local_28 + uVar1;
      local_2c = iVar2 * 0x100 ^ iVar2 + local_2c;
      local_18 = local_2c + uVar3;
      local_30 = uVar1 >> 9 ^ uVar1 + iVar2;
      local_1c = local_30 + uVar4;
      local_14 = local_18 + uVar1;
      in_RDI->mem[local_10] = local_14;
      in_RDI->mem[local_10 + 1] = local_18;
      in_RDI->mem[local_10 + 2] = local_1c;
      in_RDI->mem[local_10 + 3] = local_20;
      in_RDI->mem[local_10 + 4] = local_24;
      in_RDI->mem[local_10 + 5] = local_28;
      in_RDI->mem[local_10 + 6] = local_2c;
      in_RDI->mem[local_10 + 7] = local_30;
    }
  }
  else {
    for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 8) {
      iVar2 = in_RDI->rsl[local_10 + 1] + local_18;
      uVar3 = in_RDI->rsl[local_10 + 2] + local_1c;
      uVar6 = iVar2 * 0x800 ^ in_RDI->rsl[local_10] + local_14;
      iVar5 = uVar6 + in_RDI->rsl[local_10 + 3] + local_20;
      uVar4 = uVar3 >> 2 ^ uVar3 + iVar2;
      uVar1 = uVar4 + in_RDI->rsl[local_10 + 4] + local_24;
      uVar3 = iVar5 * 0x100 ^ iVar5 + uVar3;
      iVar2 = uVar3 + in_RDI->rsl[local_10 + 5] + local_28;
      local_20 = uVar1 >> 0x10 ^ uVar1 + iVar5;
      uVar7 = local_20 + in_RDI->rsl[local_10 + 6] + local_2c;
      local_24 = iVar2 * 0x400 ^ iVar2 + uVar1;
      iVar5 = local_24 + in_RDI->rsl[local_10 + 7] + local_30;
      local_28 = uVar7 >> 4 ^ uVar7 + iVar2;
      uVar6 = local_28 + uVar6;
      local_2c = iVar5 * 0x100 ^ iVar5 + uVar7;
      local_18 = local_2c + uVar4;
      local_30 = uVar6 >> 9 ^ uVar6 + iVar5;
      local_1c = local_30 + uVar3;
      local_14 = local_18 + uVar6;
      in_RDI->mem[local_10] = local_14;
      in_RDI->mem[local_10 + 1] = local_18;
      in_RDI->mem[local_10 + 2] = local_1c;
      in_RDI->mem[local_10 + 3] = local_20;
      in_RDI->mem[local_10 + 4] = local_24;
      in_RDI->mem[local_10 + 5] = local_28;
      in_RDI->mem[local_10 + 6] = local_2c;
      in_RDI->mem[local_10 + 7] = local_30;
    }
    for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 8) {
      iVar2 = in_RDI->mem[local_10 + 1] + local_18;
      uVar3 = in_RDI->mem[local_10 + 2] + local_1c;
      uVar6 = iVar2 * 0x800 ^ in_RDI->mem[local_10] + local_14;
      iVar5 = uVar6 + in_RDI->mem[local_10 + 3] + local_20;
      uVar4 = uVar3 >> 2 ^ uVar3 + iVar2;
      uVar1 = uVar4 + in_RDI->mem[local_10 + 4] + local_24;
      uVar3 = iVar5 * 0x100 ^ iVar5 + uVar3;
      iVar2 = uVar3 + in_RDI->mem[local_10 + 5] + local_28;
      local_20 = uVar1 >> 0x10 ^ uVar1 + iVar5;
      uVar7 = local_20 + in_RDI->mem[local_10 + 6] + local_2c;
      local_24 = iVar2 * 0x400 ^ iVar2 + uVar1;
      iVar5 = local_24 + in_RDI->mem[local_10 + 7] + local_30;
      local_28 = uVar7 >> 4 ^ uVar7 + iVar2;
      uVar6 = local_28 + uVar6;
      local_2c = iVar5 * 0x100 ^ iVar5 + uVar7;
      local_18 = local_2c + uVar4;
      local_30 = uVar6 >> 9 ^ uVar6 + iVar5;
      local_1c = local_30 + uVar3;
      local_14 = local_18 + uVar6;
      in_RDI->mem[local_10] = local_14;
      in_RDI->mem[local_10 + 1] = local_18;
      in_RDI->mem[local_10 + 2] = local_1c;
      in_RDI->mem[local_10 + 3] = local_20;
      in_RDI->mem[local_10 + 4] = local_24;
      in_RDI->mem[local_10 + 5] = local_28;
      in_RDI->mem[local_10 + 6] = local_2c;
      in_RDI->mem[local_10 + 7] = local_30;
    }
  }
  isaac_gen_group(in_RDI);
  in_RDI->cnt = 0x100;
  return;
}

Assistant:

void isaac_init(isaacctx *ctx, int flag)
{
    int i;
    uint32_t a;
    uint32_t b;
    uint32_t c;
    uint32_t d;
    uint32_t e;
    uint32_t f;
    uint32_t g;
    uint32_t h;
    uint32_t *m;
    uint32_t *r;

    ctx->a = ctx->b = ctx->c = 0;
    m = ctx->mem;
    r = ctx->rsl;
    a = b = c = d = e = f = g = h = 0x9e3779b9;         /* the golden ratio */

    /* scramble the initial settings */
    for (i = 0 ; i < 4 ; ++i)
    {
        isaac_mix(a, b, c, d, e, f, g, h);
    }

    if (flag) 
    {
        /* initialize using the contents of ctx->rsl[] as the seed */
        for (i = 0 ; i < ISAAC_RANDSIZ ; i += 8)
        {
            a += r[i];   b += r[i+1]; c += r[i+2]; d += r[i+3];
            e += r[i+4]; f += r[i+5]; g += r[i+6]; h += r[i+7];
            isaac_mix(a, b, c, d, e, f, g, h);
            m[i] = a;   m[i+1] = b; m[i+2] = c; m[i+3] = d;
            m[i+4] = e; m[i+5] = f; m[i+6] = g; m[i+7] = h;
        }

        /* do a second pass to make all of the seed affect all of m */
        for (i = 0 ; i < ISAAC_RANDSIZ ; i += 8)
        {
            a += m[i];   b += m[i+1]; c += m[i+2]; d += m[i+3];
            e += m[i+4]; f += m[i+5]; g += m[i+6]; h += m[i+7];
            isaac_mix(a, b, c, d, e, f, g, h);
            m[i] = a;   m[i+1] = b; m[i+2] = c; m[i+3] = d;
            m[i+4] = e; m[i+5] = f; m[i+6] = g; m[i+7] = h;
        }
    }
    else
    {
        /* initialize using fixed initial settings */
        for (i = 0 ; i < ISAAC_RANDSIZ ; i += 8)
        {
            isaac_mix(a, b, c, d, e, f, g, h);
            m[i] = a; m[i+1] = b; m[i+2] = c; m[i+3] = d;
            m[i+4] = e; m[i+5] = f; m[i+6] = g; m[i+7] = h;
        }
    }

    /* fill in the first set of results */
    isaac_gen_group(ctx);

    /* prepare to use the first set of results */    
    ctx->cnt = ISAAC_RANDSIZ;
}